

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

void __thiscall QCachedPainter::~QCachedPainter(QCachedPainter *this)

{
  QCachedPainter *in_RDI;
  
  finish(in_RDI);
  if ((in_RDI->m_alreadyCached & 1U) == 0) {
    QPixmapCache::insert((QString *)&in_RDI->m_pixmapName,(QPixmap *)&in_RDI->m_pixmap);
  }
  QPixmap::~QPixmap(&in_RDI->m_pixmap);
  QString::~QString((QString *)0x40bad8);
  std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::~unique_ptr
            ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)in_RDI);
  return;
}

Assistant:

QCachedPainter::~QCachedPainter()
{
    finish();
    if (!m_alreadyCached)
        QPixmapCache::insert(m_pixmapName, m_pixmap);
}